

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs *bs,size_t bitsToSeek)

{
  bool bVar1;
  ma_bool32 mVar2;
  ma_dr_flac_cache_t mVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ma_uint8 bin_1;
  ma_uint8 bin;
  ma_uint8 local_1a;
  ma_uint8 local_19;
  
  uVar4 = 0x40 - (ulong)bs->consumedBits;
  uVar6 = bitsToSeek - uVar4;
  if (bitsToSeek < uVar4 || uVar6 == 0) {
    bs->consumedBits = bs->consumedBits + (int)bitsToSeek;
    bs->cache = bs->cache << ((byte)bitsToSeek & 0x3f);
    return 1;
  }
  bs->consumedBits = 0x40;
  bs->cache = 0;
  do {
    if (uVar6 < 0x40) {
      while (7 < uVar6) {
        mVar2 = ma_dr_flac__read_uint8(bs,8,&local_19);
        uVar6 = uVar6 - 8;
        if (mVar2 == 0) {
          return 0;
        }
      }
      if (uVar6 == 0) {
        return 1;
      }
      mVar2 = ma_dr_flac__read_uint8(bs,(uint)uVar6,&local_1a);
      if (mVar2 == 0) {
        return 0;
      }
      return 1;
    }
    if ((bs->consumedBits == 0x40) && (mVar2 = ma_dr_flac__reload_cache(bs), mVar2 == 0)) {
LAB_0016fe0c:
      bVar1 = true;
    }
    else {
      uVar4 = 0x40 - (ulong)bs->consumedBits;
      if (uVar4 < 0x20) {
        mVar2 = ma_dr_flac__reload_cache(bs);
        bVar1 = true;
        if (mVar2 != 0) {
          uVar5 = 0x20 - (int)uVar4;
          if ((ulong)uVar5 <= 0x40 - (ulong)bs->consumedBits) {
            bs->consumedBits = bs->consumedBits + uVar5;
            mVar3 = bs->cache << ((byte)uVar5 & 0x3f);
            goto LAB_0016fda8;
          }
        }
        goto LAB_0016fe2a;
      }
      bs->consumedBits = bs->consumedBits + 0x20;
      mVar3 = bs->cache << 0x20;
LAB_0016fda8:
      bs->cache = mVar3;
      if ((bs->consumedBits == 0x40) && (mVar2 = ma_dr_flac__reload_cache(bs), mVar2 == 0))
      goto LAB_0016fe0c;
      uVar4 = 0x40 - (ulong)bs->consumedBits;
      if (uVar4 < 0x20) {
        mVar2 = ma_dr_flac__reload_cache(bs);
        bVar1 = true;
        if (mVar2 != 0) {
          uVar5 = 0x20 - (int)uVar4;
          if ((ulong)uVar5 <= 0x40 - (ulong)bs->consumedBits) {
            bs->consumedBits = bs->consumedBits + uVar5;
            mVar3 = bs->cache << ((byte)uVar5 & 0x3f);
            goto LAB_0016fe21;
          }
        }
      }
      else {
        bs->consumedBits = bs->consumedBits + 0x20;
        mVar3 = bs->cache << 0x20;
LAB_0016fe21:
        bs->cache = mVar3;
        bVar1 = false;
      }
    }
LAB_0016fe2a:
    uVar6 = uVar6 - 0x40;
    if (bVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_bits(ma_dr_flac_bs* bs, size_t bitsToSeek)
{
    if (bitsToSeek <= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs)) {
        bs->consumedBits += (ma_uint32)bitsToSeek;
        bs->cache <<= bitsToSeek;
        return MA_TRUE;
    } else {
        bitsToSeek       -= MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->consumedBits += MA_DR_FLAC_CACHE_L1_BITS_REMAINING(bs);
        bs->cache         = 0;
#ifdef MA_64BIT
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint64 bin;
            if (!ma_dr_flac__read_uint64(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#else
        while (bitsToSeek >= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs)) {
            ma_uint32 bin;
            if (!ma_dr_flac__read_uint32(bs, MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs), &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= MA_DR_FLAC_CACHE_L1_SIZE_BITS(bs);
        }
#endif
        while (bitsToSeek >= 8) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, 8, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek -= 8;
        }
        if (bitsToSeek > 0) {
            ma_uint8 bin;
            if (!ma_dr_flac__read_uint8(bs, (ma_uint32)bitsToSeek, &bin)) {
                return MA_FALSE;
            }
            bitsToSeek = 0;
        }
        MA_DR_FLAC_ASSERT(bitsToSeek == 0);
        return MA_TRUE;
    }
}